

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Lamp>
          (Structure *this,Lamp *dest,FileDatabase *db)

{
  element_type *this_00;
  int local_24;
  FileDatabase *pFStack_20;
  int temp;
  FileDatabase *db_local;
  Lamp *dest_local;
  Structure *this_local;
  
  pFStack_20 = db;
  db_local = (FileDatabase *)dest;
  dest_local = (Lamp *)this;
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  local_24 = 0;
  ReadField<2,int>(this,&local_24,"type",pFStack_20);
  *(int *)&db_local[4].reader.
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi = local_24;
  ReadField<1,short>(this,(short *)((long)&db_local[4].reader.
                                           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 4),"flag",pFStack_20);
  ReadField<1,short>(this,(short *)((long)&db_local[4].reader.
                                           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 6),"colormodel",pFStack_20);
  ReadField<1,short>(this,(short *)&db_local[4].entries,"totex",pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4].entries.
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4),"r",
                     pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4].entries.
                                    super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    .
                                    super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,"g",pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4].entries.
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4),"b",
                     pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4].entries.
                                    super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    .
                                    super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"k",
                     pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4].entries.
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     "energy",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._stats,"dist",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._stats.pointers_resolved,"spotsize",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._stats.cache_hits,"spotblend",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._stats.cached_objects,"coeff_const",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4].field_0xb8,"coeff_lin",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4].field_0xbc,"coeff_quad",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._cache,"att1",pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4]._cache.caches.
                                           super_vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           .
                                           super__Vector_base<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4),"att2",
                     pFStack_20);
  ReadField<1,int>(this,&local_24,"falloff_type",pFStack_20);
  *(int *)&db_local[4]._cache.caches.
           super_vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
           .
           super__Vector_base<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_24;
  ReadField<1,float>(this,(float *)((long)&db_local[4]._cache.db + 4),"sun_brightness",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._cache.caches.
                                    super_vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"area_size",
                     pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4]._cache.caches.
                                           super_vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           .
                                           super__Vector_base<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     "area_sizey",pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4]._cache.db,"area_sizez",pFStack_20);
  ReadField<1,short>(this,(short *)((long)&db_local[4]._cache.caches.
                                           super_vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           .
                                           super__Vector_base<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4),
                     "area_shape",pFStack_20);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pFStack_20->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Lamp> (
    Lamp& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Lamp::Type>(temp);
    ReadField<ErrorPolicy_Igno>(dest.flags,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.colormodel,"colormodel",db);
    ReadField<ErrorPolicy_Igno>(dest.totex,"totex",db);
    ReadField<ErrorPolicy_Warn>(dest.r,"r",db);
    ReadField<ErrorPolicy_Warn>(dest.g,"g",db);
    ReadField<ErrorPolicy_Warn>(dest.b,"b",db);
    ReadField<ErrorPolicy_Warn>(dest.k,"k",db);
    ReadField<ErrorPolicy_Igno>(dest.energy,"energy",db);
    ReadField<ErrorPolicy_Warn>(dest.dist,"dist",db);
    ReadField<ErrorPolicy_Igno>(dest.spotsize,"spotsize",db);
    ReadField<ErrorPolicy_Igno>(dest.spotblend,"spotblend",db);
    ReadField<ErrorPolicy_Warn>(dest.constant_coefficient, "coeff_const", db);
    ReadField<ErrorPolicy_Warn>(dest.linear_coefficient, "coeff_lin", db);
    ReadField<ErrorPolicy_Warn>(dest.quadratic_coefficient, "coeff_quad", db);
    ReadField<ErrorPolicy_Igno>(dest.att1,"att1",db);
    ReadField<ErrorPolicy_Igno>(dest.att2,"att2",db);
    ReadField<ErrorPolicy_Igno>(temp,"falloff_type",db);
    dest.falloff_type = static_cast<Assimp::Blender::Lamp::FalloffType>(temp);
    ReadField<ErrorPolicy_Igno>(dest.sun_brightness,"sun_brightness",db);
    ReadField<ErrorPolicy_Igno>(dest.area_size,"area_size",db);
    ReadField<ErrorPolicy_Igno>(dest.area_sizey,"area_sizey",db);
    ReadField<ErrorPolicy_Igno>(dest.area_sizez,"area_sizez",db);
    ReadField<ErrorPolicy_Igno>(dest.area_shape,"area_shape",db);

    db.reader->IncPtr(size);
}